

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler_ir2.hpp
# Opt level: O0

string * decompile_data_abi_cxx11_
                   (string *__return_storage_ptr__,DecompiledVar *v,DecompilerIR2 *param_2)

{
  unreachable_exception *this;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  string local_90;
  string local_70;
  undefined1 local_39;
  unreachable_exception *local_38;
  char *local_30;
  char *type_cstr;
  DecompilerIR2 *local_20;
  DecompilerIR2 *param_1_local;
  DecompiledVar *v_local;
  string *output;
  
  type_cstr._7_1_ = 0;
  local_20 = param_2;
  param_1_local = (DecompilerIR2 *)v;
  v_local = (DecompiledVar *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_39 = 0;
  if (*(char *)((long)&(param_1_local->data).
                       super__Vector_base<DecompiledData,_std::allocator<DecompiledData>_>._M_impl.
                       super__Vector_impl_data._M_start + 1) == '\0') {
    local_a8 = "";
  }
  else {
    if (*(char *)((long)&(param_1_local->data).
                         super__Vector_base<DecompiledData,_std::allocator<DecompiledData>_>._M_impl
                         .super__Vector_impl_data._M_start + 1) == '\x01') {
      local_b0 = "";
    }
    else {
      if (*(char *)((long)&(param_1_local->data).
                           super__Vector_base<DecompiledData,_std::allocator<DecompiledData>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1) == '\x02') {
        local_b8 = "s";
      }
      else {
        if (*(char *)((long)&(param_1_local->data).
                             super__Vector_base<DecompiledData,_std::allocator<DecompiledData>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1) != '\x03') {
          this = (unreachable_exception *)__cxa_allocate_exception(0x10);
          local_39 = 1;
          local_38 = this;
          unreachable_exception::unreachable_exception
                    (this,
                     "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/decompiler_ir2.hpp(228)."
                    );
          __cxa_throw(this,&unreachable_exception::typeinfo,
                      unreachable_exception::~unreachable_exception);
        }
        local_b8 = "v";
      }
      local_b0 = local_b8;
    }
    local_a8 = local_b0;
  }
  local_30 = local_a8;
  if (((ulong)(param_1_local->data).
              super__Vector_base<DecompiledData,_std::allocator<DecompiledData>_>._M_impl.
              super__Vector_impl_data._M_start & 1) == 0) {
    std::__cxx11::to_string
              (&local_90,
               *(uint *)((long)&(param_1_local->data).
                                super__Vector_base<DecompiledData,_std::allocator<DecompiledData>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4) >> 2);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_30);
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a8);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::to_string
              (&local_70,
               *(uint *)((long)&(param_1_local->data).
                                super__Vector_base<DecompiledData,_std::allocator<DecompiledData>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decompile_data(const DecompiledVar& v, DecompilerIR2&)
{
    std::string output;

    auto type_cstr = v.type == VarType::Int? "" :
                     v.type == VarType::Float? "" :
                     v.type == VarType::TextLabel? "s" :
                     v.type == VarType::TextLabel16? "v" :
                     Unreachable();

    if(v.global)
    {
        output += type_cstr;
        output.push_back('&');
        output.append(std::to_string(v.offset));
    }
    else
    {
        output.append(std::to_string(v.offset / 4));
        output.push_back('@');
        output += type_cstr;
    }

    return output;
}